

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

TEXTURE_FORMAT Diligent::TypelessFormatToSRGB(TEXTURE_FORMAT Fmt)

{
  undefined2 local_a;
  TEXTURE_FORMAT Fmt_local;
  
  if (Fmt == TEX_FORMAT_RGBA8_TYPELESS) {
    local_a = TEX_FORMAT_RGBA8_UNORM_SRGB;
  }
  else if (Fmt == TEX_FORMAT_BC1_TYPELESS) {
    local_a = TEX_FORMAT_BC1_UNORM_SRGB;
  }
  else if (Fmt == TEX_FORMAT_BC2_TYPELESS) {
    local_a = TEX_FORMAT_BC2_UNORM_SRGB;
  }
  else if (Fmt == TEX_FORMAT_BC3_TYPELESS) {
    local_a = TEX_FORMAT_BC3_UNORM_SRGB;
  }
  else if (Fmt == TEX_FORMAT_BGRA8_TYPELESS) {
    local_a = TEX_FORMAT_BGRA8_UNORM_SRGB;
  }
  else if (Fmt == TEX_FORMAT_BGRX8_TYPELESS) {
    local_a = TEX_FORMAT_BGRX8_UNORM_SRGB;
  }
  else {
    local_a = Fmt;
    if (Fmt == TEX_FORMAT_BC7_TYPELESS) {
      local_a = TEX_FORMAT_BC7_UNORM_SRGB;
    }
  }
  return local_a;
}

Assistant:

TEXTURE_FORMAT TypelessFormatToSRGB(TEXTURE_FORMAT Fmt)
{
    static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Please update the switch below to handle the new texture format, if needed");
    switch (Fmt)
    {
        case TEX_FORMAT_RGBA8_TYPELESS:
            return TEX_FORMAT_RGBA8_UNORM_SRGB;

        case TEX_FORMAT_BC1_TYPELESS:
            return TEX_FORMAT_BC1_UNORM_SRGB;

        case TEX_FORMAT_BC2_TYPELESS:
            return TEX_FORMAT_BC2_UNORM_SRGB;

        case TEX_FORMAT_BC3_TYPELESS:
            return TEX_FORMAT_BC3_UNORM_SRGB;

        case TEX_FORMAT_BGRA8_TYPELESS:
            return TEX_FORMAT_BGRA8_UNORM_SRGB;

        case TEX_FORMAT_BGRX8_TYPELESS:
            return TEX_FORMAT_BGRX8_UNORM_SRGB;

        case TEX_FORMAT_BC7_TYPELESS:
            return TEX_FORMAT_BC7_UNORM_SRGB;

        default:
            return Fmt;
    }
}